

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O2

QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_> * __thiscall
QAccessibleWidget::relations
          (QList<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>
           *__return_storage_ptr__,QAccessibleWidget *this,Relation match)

{
  qsizetype qVar1;
  QWidget **ppQVar2;
  QWidget *pQVar3;
  QObject *pQVar4;
  QWidget *pQVar5;
  QWidget *pQVar6;
  int i;
  undefined1 *puVar7;
  long lVar8;
  int sig;
  long lVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QAccessibleInterface *iface;
  QArrayDataPointer<char> local_90;
  QArrayDataPointer<QObject_*> local_78;
  QArrayDataPointer<QWidget_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr =
       (pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> *)0x0;
  if (((uint)match.super_QFlagsStorageHelper<QAccessible::RelationFlag,_4>.
             super_QFlagsStorage<QAccessible::RelationFlag>.i & 1) != 0) {
    local_90.d._0_4_ = 1;
    pQVar3 = widget(this);
    pQVar3 = *(QWidget **)(*(long *)&pQVar3->field_0x8 + 0x10);
    if (pQVar3 != (QWidget *)0x0) {
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
      _q_ac_childWidgets((QWidgetList *)&local_58,pQVar3);
      ppQVar2 = local_58.ptr;
      lVar8 = local_58.size << 3;
      for (lVar9 = 0; lVar8 != lVar9; lVar9 = lVar9 + 8) {
        pQVar4 = (QObject *)
                 QtPrivate::qobject_cast_helper<QLabel*,QObject>
                           (*(QObject **)((long)ppQVar2 + lVar9));
        if (pQVar4 != (QObject *)0x0) {
          pQVar5 = QLabel::buddy((QLabel *)pQVar4);
          pQVar6 = widget(this);
          if (pQVar5 == pQVar6) {
            local_78.d = (Data *)QAccessible::queryAccessibleInterface(pQVar4);
            QList<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>::
            emplaceBack<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>const&>
                      ((QList<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>> *)
                       __return_storage_ptr__,(QAccessibleInterface **)&local_78,
                       (QFlags<QAccessible::RelationFlag> *)&local_90);
          }
        }
      }
      pQVar4 = (QObject *)QtPrivate::qobject_cast_helper<QGroupBox*,QObject>(&pQVar3->super_QObject)
      ;
      if (pQVar4 != (QObject *)0x0) {
        QGroupBox::title((QString *)&local_78,(QGroupBox *)pQVar4);
        qVar1 = local_78.size;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
        if ((undefined1 *)qVar1 != (undefined1 *)0x0) {
          local_78.d = (Data *)QAccessible::queryAccessibleInterface(pQVar4);
          QList<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>::
          emplaceBack<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>const&>
                    ((QList<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>> *)
                     __return_storage_ptr__,(QAccessibleInterface **)&local_78,
                     (QFlags<QAccessible::RelationFlag> *)&local_90);
        }
      }
      QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_58);
    }
  }
  if (((uint)match.super_QFlagsStorageHelper<QAccessible::RelationFlag,_4>.
             super_QFlagsStorage<QAccessible::RelationFlag>.i & 8) != 0) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (QWidget **)0x0;
    local_58.size = 0;
    (**(code **)(*(long *)this + 0x18))();
    for (uVar10 = 0; uVar10 < (ulong)(this->d->primarySignals).d.size; uVar10 = uVar10 + 1) {
      local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
      QString::toLatin1_helper((QString *)&local_90);
      QObjectPrivate::receiverList((char *)&local_78);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_90);
      QList<QObject_*>::append((QList<QObject_*> *)&local_58,(QList<QObject_*> *)&local_78);
      QArrayDataPointer<QObject_*>::~QArrayDataPointer(&local_78);
    }
    local_78.d = (Data *)(**(code **)(*(long *)this + 0x18))();
    QtPrivate::sequential_erase_with_copy<QList<QObject*>,QObject*>
              ((QList<QObject_*> *)&local_58,(QObject **)&local_78);
    for (puVar7 = (undefined1 *)0x0; puVar7 < (ulong)local_58.size; puVar7 = puVar7 + 1) {
      local_90.d._0_4_ = 8;
      local_78.d = (Data *)QAccessible::queryAccessibleInterface
                                     (&local_58.ptr[(long)puVar7]->super_QObject);
      if (local_78.d != (Data *)0x0) {
        QList<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>::
        emplaceBack<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>const&>
                  ((QList<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>> *)
                   __return_storage_ptr__,(QAccessibleInterface **)&local_78,
                   (QFlags<QAccessible::RelationFlag> *)&local_90);
      }
    }
    QArrayDataPointer<QObject_*>::~QArrayDataPointer((QArrayDataPointer<QObject_*> *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<std::pair<QAccessibleInterface *, QAccessible::Relation>>
QAccessibleWidget::relations(QAccessible::Relation match /*= QAccessible::AllRelations*/) const
{
    QList<std::pair<QAccessibleInterface *, QAccessible::Relation>> rels;
    if (match & QAccessible::Label) {
        const QAccessible::Relation rel = QAccessible::Label;
        if (QWidget *parent = widget()->parentWidget()) {
#if QT_CONFIG(shortcut) && QT_CONFIG(label)
            // first check for all siblings that are labels to us
            // ideally we would go through all objects and check, but that
            // will be too expensive
            const QList<QWidget*> kids = _q_ac_childWidgets(parent);
            for (QWidget *kid : kids) {
                if (QLabel *labelSibling = qobject_cast<QLabel*>(kid)) {
                    if (labelSibling->buddy() == widget()) {
                        QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(labelSibling);
                        rels.emplace_back(iface, rel);
                    }
                }
            }
#endif
#if QT_CONFIG(groupbox)
            QGroupBox *groupbox = qobject_cast<QGroupBox*>(parent);
            if (groupbox && !groupbox->title().isEmpty()) {
                QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(groupbox);
                rels.emplace_back(iface, rel);
            }
#endif
        }
    }

    if (match & QAccessible::Controlled) {
        QObjectList allReceivers;
        QObject *connectionObject = object();
        for (int sig = 0; sig < d->primarySignals.size(); ++sig) {
            const QObjectList receivers = connectionObject->d_func()->receiverList(d->primarySignals.at(sig).toLatin1());
            allReceivers += receivers;
        }

        allReceivers.removeAll(object());  //### The object might connect to itself internally

        for (int i = 0; i < allReceivers.size(); ++i) {
            const QAccessible::Relation rel = QAccessible::Controlled;
            QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(allReceivers.at(i));
            if (iface)
                rels.emplace_back(iface, rel);
        }
    }

    return rels;
}